

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdpu382_com.c
# Opt level: O0

RK_S32 vdpu382_get_rcb_buf_size(Vdpu382RcbInfo *info,RK_S32 width,RK_S32 height)

{
  RK_S32 RVar1;
  RK_S32 RVar2;
  RK_S32 RVar3;
  int iVar4;
  RK_S32 offset;
  RK_S32 height_local;
  RK_S32 width_local;
  Vdpu382RcbInfo *info_local;
  
  RVar1 = update_size_offset(info,0x8b,0,width,0);
  RVar2 = update_size_offset(info,0x85,RVar1,width,1);
  RVar3 = update_size_offset(info,0x86,RVar2 + RVar1,width,2);
  iVar4 = RVar3 + RVar2 + RVar1;
  RVar1 = update_size_offset(info,0x88,iVar4,width,3);
  iVar4 = RVar1 + iVar4;
  RVar1 = update_size_offset(info,0x89,iVar4,width,4);
  iVar4 = RVar1 + iVar4;
  RVar1 = update_size_offset(info,0x8c,iVar4,width,5);
  iVar4 = RVar1 + iVar4;
  RVar1 = update_size_offset(info,0x8d,iVar4,width,6);
  iVar4 = RVar1 + iVar4;
  RVar1 = update_size_offset(info,0x87,iVar4,height,7);
  iVar4 = RVar1 + iVar4;
  RVar1 = update_size_offset(info,0x8a,iVar4,height,8);
  iVar4 = RVar1 + iVar4;
  RVar1 = update_size_offset(info,0x8e,iVar4,height,9);
  return RVar1 + iVar4;
}

Assistant:

RK_S32 vdpu382_get_rcb_buf_size(Vdpu382RcbInfo *info, RK_S32 width, RK_S32 height)
{
    RK_S32 offset = 0;

    offset += update_size_offset(info, 139, offset, width, RCB_DBLK_ROW);
    offset += update_size_offset(info, 133, offset, width, RCB_INTRA_ROW);
    offset += update_size_offset(info, 134, offset, width, RCB_TRANSD_ROW);
    offset += update_size_offset(info, 136, offset, width, RCB_STRMD_ROW);
    offset += update_size_offset(info, 137, offset, width, RCB_INTER_ROW);
    offset += update_size_offset(info, 140, offset, width, RCB_SAO_ROW);
    offset += update_size_offset(info, 141, offset, width, RCB_FBC_ROW);
    /* col rcb */
    offset += update_size_offset(info, 135, offset, height, RCB_TRANSD_COL);
    offset += update_size_offset(info, 138, offset, height, RCB_INTER_COL);
    offset += update_size_offset(info, 142, offset, height, RCB_FILT_COL);

    return offset;
}